

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterHandshakeSentFatalAlert_Test::TestBody
          (SSLVersionTest_WriteAfterHandshakeSentFatalAlert_Test *this)

{
  char cVar1;
  undefined8 wbio;
  UniquePtr<SSL> ssl_00;
  UniquePtr<BIO> rbio_00;
  bool bVar2;
  BIO_METHOD *type;
  ulong uVar3;
  char *pcVar4;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> _Var5;
  char *in_R9;
  long lVar6;
  int iVar7;
  UniquePtr<SSL_CTX> *pUVar8;
  ScopedTrace gtest_trace_3200;
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  uint8_t *unused;
  UniquePtr<SSL> ssl;
  UniquePtr<BIO> mem;
  UniquePtr<BIO> rbio;
  size_t len;
  char local_72 [2];
  AssertHelper local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> invalid;
  uint32_t err;
  UniquePtr<SSL_CTX> *local_40;
  UniquePtr<SSL_CTX> *local_38;
  
  local_72[0] = '\0';
  local_72[1] = '\x01';
  local_40 = &(this->super_SSLVersionTest).server_ctx_;
  local_38 = &(this->super_SSLVersionTest).client_ctx_;
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 2) {
      return;
    }
    cVar1 = local_72[lVar6];
    pcVar4 = "client";
    pUVar8 = local_38;
    if (cVar1 != '\0') {
      pcVar4 = "server";
      pUVar8 = local_40;
    }
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_3200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xc80,pcVar4);
    ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
         SSL_new((SSL_CTX *)
                 (pUVar8->_M_t).super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (tuple<ssl_st_*,_bssl::internal::Deleter>)
                           ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                           (_Head_base<0UL,_ssl_st_*,_false>)0x0);
    if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
        ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl == (_Head_base<0UL,_ssl_st_*,_false>)0x0
       ) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&invalid,(AssertionResult *)0x301297,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&rbio,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc84,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&rbio,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rbio);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      goto LAB_0016e1e5;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    _Var5._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
         (tuple<ssl_st_*,_bssl::internal::Deleter>)
         (tuple<ssl_st_*,_bssl::internal::Deleter>)
         ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
    if (cVar1 == '\0') {
      SSL_set_connect_state
                ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    }
    else {
      SSL_set_accept_state
                ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    }
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = SSLVersionTest::is_dtls
                      ((SSLVersionTest *)
                       _Var5._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    if (bVar2) {
      gtest_ar.success_ = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
      gtest_ar.success_ = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
      gtest_ar.success_ = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
      iVar7 = 8;
      while( true ) {
        bVar2 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if (bVar2) break;
        gtest_ar._0_8_ = (ulong)(uint7)gtest_ar._1_7_ << 8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&invalid,(uchar *)&gtest_ar);
      }
      gtest_ar._0_8_ = (ulong)(uint7)gtest_ar._1_7_ << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
      gtest_ar.success_ = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
      gtest_ar._0_8_ = (ulong)(uint7)gtest_ar._1_7_ << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&invalid,(uchar *)&gtest_ar);
    }
    else {
      gtest_ar._0_7_ = 0x64696c61766e69;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&invalid,(string *)&gtest_ar
                 ,&gtest_ar.field_0x7);
    }
    rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
         BIO_new_mem_buf(invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (int)invalid.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)invalid.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ =
         (tuple<bio_st_*,_bssl::internal::Deleter>)
         rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bio_st_*,_false>)0x0;
    if ((tuple<bio_st_*,_bssl::internal::Deleter>)
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0
       ) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    rbio_00._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>
    ._M_head_impl =
         rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
    rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
    SSL_set0_rbio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                  (BIO *)rbio_00._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    type = BIO_s_mem();
    mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>
    ._M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(type);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ =
         (tuple<bio_st_*,_bssl::internal::Deleter>)
         mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bio_st_*,_false>)0x0;
    if ((tuple<bio_st_*,_bssl::internal::Deleter>)
        mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0
       ) {
      testing::Message::Message((Message *)&unused);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"mem","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xca3,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&unused);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(unused._4_4_,(int)unused) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(unused._4_4_,(int)unused) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&mem);
      goto LAB_0016e1ce;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    ssl_00 = ssl;
    UpRef((bssl *)&gtest_ar,
          (BIO *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    wbio = gtest_ar._0_8_;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    SSL_set0_wbio((SSL *)ssl_00._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(BIO *)wbio);
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar);
    gtest_ar__1.success_ = true;
    gtest_ar__1._1_3_ = 0xffffff;
    unused._0_4_ = SSL_do_handshake((SSL *)ssl._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"-1","SSL_do_handshake(ssl.get())",(int *)&gtest_ar__1,
               (int *)&unused);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      pcVar4 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&unused,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xca7,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&unused,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
      if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar__1.success_ = true;
    gtest_ar__1._1_3_ = 0;
    unused._0_4_ = SSL_get_error((SSL *)ssl._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","SSL_get_error(ssl.get(), -1)",(int *)&gtest_ar__1,
               (int *)&unused);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      pcVar4 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&unused,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xca8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&unused,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
      if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    uVar3 = ERR_get_error();
    err = (uint32_t)uVar3;
    iVar7 = BIO_mem_contents((BIO *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                    _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&unused,&len
                            );
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar7 != 0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                 (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xcaf,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c8);
LAB_0016dfab:
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      bVar2 = false;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1.success_ = false;
      gtest_ar__1._1_3_ = 0;
      testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","len",(uint *)&gtest_ar__1,&len);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      iVar7 = BIO_reset((BIO *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar7 != 0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                   (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb1,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1.success_ = true;
      gtest_ar__1._1_3_ = 0xffffff;
      local_c8.data_._0_4_ =
           SSL_write((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,"a",1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"-1","SSL_write(ssl.get(), \"a\", 1)",(int *)&gtest_ar__1,
                 (int *)&local_c8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar__1.success_ = true;
      gtest_ar__1._1_3_ = 0;
      local_c8.data_._0_4_ =
           SSL_get_error((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","SSL_get_error(ssl.get(), -1)",(int *)&gtest_ar__1,
                 (int *)&local_c8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      uVar3 = ERR_get_error();
      gtest_ar__1._0_4_ = SUB84(uVar3,0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"err","ERR_get_error()",&err,(uint *)&gtest_ar__1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      iVar7 = BIO_mem_contents((BIO *)mem._M_t.
                                      super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&unused,
                               &len);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar7 != 0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                   (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcb9,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c8);
        goto LAB_0016dfab;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1.success_ = false;
      gtest_ar__1._1_3_ = 0;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","len",(uint *)&gtest_ar__1,&len);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcba,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar2 = true;
    }
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&mem);
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&rbio);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&invalid);
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_3200);
    lVar6 = lVar6 + 1;
    if (!bVar2) {
      return;
    }
  }
  testing::Message::Message((Message *)&mem);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"rbio","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&unused,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0xc9f,(char *)gtest_ar._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&unused,(Message *)&mem);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
      mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
LAB_0016e1ce:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&rbio);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0016e1e5:
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_3200);
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterHandshakeSentFatalAlert) {
  for (bool test_server : {false, true}) {
    SCOPED_TRACE(test_server ? "server" : "client");

    bssl::UniquePtr<SSL> ssl(
        SSL_new(test_server ? server_ctx_.get() : client_ctx_.get()));
    ASSERT_TRUE(ssl);
    if (test_server) {
      SSL_set_accept_state(ssl.get());
    } else {
      SSL_set_connect_state(ssl.get());
    }

    std::vector<uint8_t> invalid;
    if (is_dtls()) {
      // In DTLS, invalid records are discarded. To cause the handshake to fail,
      // use a valid handshake record with invalid contents.
      invalid.push_back(SSL3_RT_HANDSHAKE);
      invalid.push_back(DTLS1_VERSION >> 8);
      invalid.push_back(DTLS1_VERSION & 0xff);
      // epoch and sequence_number
      for (int i = 0; i < 8; i++) {
        invalid.push_back(0);
      }
      // A one-byte fragment is invalid.
      invalid.push_back(0);
      invalid.push_back(1);
      // Arbitrary contents.
      invalid.push_back(0);
    } else {
      invalid = {'i', 'n', 'v', 'a', 'l', 'i', 'd'};
    }
    bssl::UniquePtr<BIO> rbio(BIO_new_mem_buf(invalid.data(), invalid.size()));
    ASSERT_TRUE(rbio);
    SSL_set0_rbio(ssl.get(), rbio.release());

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl.get(), bssl::UpRef(mem).release());

    // The handshake should fail.
    EXPECT_EQ(-1, SSL_do_handshake(ssl.get()));
    EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(ssl.get(), -1));
    uint32_t err = ERR_get_error();

    // |ssl| should have written an alert (and, in the client's case, a
    // ClientHello) to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail, with the same error as the handshake.
    EXPECT_EQ(-1, SSL_write(ssl.get(), "a", 1));
    EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(ssl.get(), -1));
    EXPECT_EQ(err, ERR_get_error());

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}